

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O3

SizedPtr __thiscall google::protobuf::internal::ThreadSafeArena::Free(ThreadSafeArena *this)

{
  SerialArenaChunk *pSVar1;
  SerialArena *this_00;
  SerialArenaChunk *this_01;
  ulong uVar2;
  void *pvVar3;
  long lVar4;
  GetDeallocator deallocator;
  Span<std::atomic<google::protobuf::internal::SerialArena_*>_> SVar5;
  SizedPtr SVar6;
  
  uVar2 = (this->alloc_policy_).policy_ & 0xfffffffffffffff8;
  if (uVar2 == 0) {
    deallocator.dealloc_ = (_func_void_void_ptr_size_t *)0x0;
  }
  else {
    deallocator.dealloc_ = *(_func_void_void_ptr_size_t **)(uVar2 + 0x18);
  }
  this_01 = (this->head_)._M_b._M_p;
  do {
    if (((ulong)this_01 & 7) != 0) {
      __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/layout.h"
                    ,0x1fe,
                    "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<google::protobuf::internal::SerialArenaChunkHeader, std::atomic<void *>, std::atomic<google::protobuf::internal::SerialArena *>>, std::integer_sequence<unsigned long, 1>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0>, std::integer_sequence<unsigned long, 0, 1>>::Pointer(Char *) const [Elements = std::tuple<google::protobuf::internal::SerialArenaChunkHeader, std::atomic<void *>, std::atomic<google::protobuf::internal::SerialArena *>>, StaticSizeSeq = std::integer_sequence<unsigned long, 1>, RuntimeSizeSeq = std::integer_sequence<unsigned long>, SizeSeq = std::integer_sequence<unsigned long, 0>, OffsetSeq = std::integer_sequence<unsigned long, 0, 1>, N = 0UL, Char = const char]"
                   );
    }
    if (*(int *)(this_01 + 8) == 0) {
      SVar6 = SerialArena::Free<google::protobuf::internal::(anonymous_namespace)::GetDeallocator>
                        (&this->first_arena_,deallocator);
      return SVar6;
    }
    pSVar1 = *(SerialArenaChunk **)this_01;
    SVar5 = SerialArenaChunk::arenas(this_01);
    if (SVar5.len_ != 0) {
      lVar4 = SVar5.len_ << 3;
      do {
        this_00 = *(SerialArena **)((long)&SVar5.ptr_[-1]._M_b._M_p + lVar4);
        if (this_00 == (SerialArena *)0x0) {
          Free((ThreadSafeArena *)&stack0xffffffffffffffc0);
LAB_00147dbb:
          Free((ThreadSafeArena *)&stack0xffffffffffffffc0);
        }
        SVar6 = SerialArena::Free<google::protobuf::internal::(anonymous_namespace)::GetDeallocator>
                          (this_00,deallocator);
        pvVar3 = SVar6.p;
        if (pvVar3 == (void *)0x0) goto LAB_00147dbb;
        if (deallocator.dealloc_ == (_func_void_void_ptr_size_t *)0x0) {
          operator_delete(pvVar3,SVar6.n);
        }
        else {
          (*deallocator.dealloc_)(pvVar3,SVar6.n);
        }
        lVar4 = lVar4 + -8;
      } while (lVar4 != 0);
    }
    operator_delete(this_01,(ulong)*(uint *)(this_01 + 8) * 0x10 + 0x10);
    this_01 = pSVar1;
  } while( true );
}

Assistant:

SizedPtr ThreadSafeArena::Free() {
  auto deallocator = GetDeallocator(alloc_policy_.get());

  WalkSerialArenaChunk([&](SerialArenaChunk* chunk) {
    absl::Span<std::atomic<SerialArena*>> span = chunk->arenas();
    // Walks arenas backward to handle the first serial arena the last. Freeing
    // in reverse-order to the order in which objects were created may not be
    // necessary to Free and we should revisit this. (b/247560530)
    for (auto it = span.rbegin(); it != span.rend(); ++it) {
      SerialArena* serial = it->load(std::memory_order_relaxed);
      ABSL_DCHECK_NE(serial, nullptr);
      // Always frees the first block of "serial" as it cannot be user-provided.
      SizedPtr mem = serial->Free(deallocator);
      ABSL_DCHECK_NE(mem.p, nullptr);
      deallocator(mem);
    }

    // Delete the chunk as we're done with it.
    internal::SizedDelete(chunk,
                          SerialArenaChunk::AllocSize(chunk->capacity()));
  });

  // The first block of the first arena is special and let the caller handle it.
  return first_arena_.Free(deallocator);
}